

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Server.cpp
# Opt level: O2

void __thiscall Server::start(Server *this)

{
  element_type *peVar1;
  EventLoop *this_00;
  _Bind<void_(Server::*(Server_*))()> local_70;
  function<void_()> local_58;
  __shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2> local_38;
  
  EventLoopThreadPool::start
            ((this->eventLoopThreadPool_)._M_t.
             super___uniq_ptr_impl<EventLoopThreadPool,_std::default_delete<EventLoopThreadPool>_>.
             _M_t.
             super__Tuple_impl<0UL,_EventLoopThreadPool_*,_std::default_delete<EventLoopThreadPool>_>
             .super__Head_base<0UL,_EventLoopThreadPool_*,_false>._M_head_impl);
  peVar1 = (this->acceptChannel_).super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  peVar1->events_ = 0x80000001;
  local_70._M_f = (offset_in_Server_to_subr)handNewConn;
  local_70._8_8_ = 0;
  local_70._M_bound_args.super__Tuple_impl<0UL,_Server_*>.super__Head_base<0UL,_Server_*,_false>.
  _M_head_impl = (_Tuple_impl<0UL,_Server_*>)(_Tuple_impl<0UL,_Server_*>)this;
  std::function<void()>::function<std::_Bind<void(Server::*(Server*))()>,void>
            ((function<void()> *)&local_58,&local_70);
  std::function<void_()>::operator=(&peVar1->readHandler_,&local_58);
  std::_Function_base::~_Function_base(&local_58.super__Function_base);
  peVar1 = (this->acceptChannel_).super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_70._M_f = (offset_in_Server_to_subr)handThisConn;
  local_70._8_8_ = 0;
  local_70._M_bound_args.super__Tuple_impl<0UL,_Server_*>.super__Head_base<0UL,_Server_*,_false>.
  _M_head_impl = (_Tuple_impl<0UL,_Server_*>)(_Tuple_impl<0UL,_Server_*>)this;
  std::function<void()>::function<std::_Bind<void(Server::*(Server*))()>,void>
            ((function<void()> *)&local_58,&local_70);
  std::function<void_()>::operator=(&peVar1->connHandler_,&local_58);
  std::_Function_base::~_Function_base(&local_58.super__Function_base);
  this_00 = this->loop_;
  std::__shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_38,
             &(this->acceptChannel_).super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>);
  EventLoop::addToPoller(this_00,(shared_ptr<Channel> *)&local_38,0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
  this->started_ = true;
  return;
}

Assistant:

void Server::start() {
  eventLoopThreadPool_->start();
  // acceptChannel_->setEvents(EPOLLIN | EPOLLET | EPOLLONESHOT);
  acceptChannel_->setEvents(EPOLLIN | EPOLLET);
  acceptChannel_->setReadHandler(bind(&Server::handNewConn, this));
  acceptChannel_->setConnHandler(bind(&Server::handThisConn, this));
  loop_->addToPoller(acceptChannel_, 0);
  started_ = true;
}